

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O2

void chrono::utils::AddConeGeometry
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,double radius,
               double height,ChVector<double> *pos,ChQuaternion<double> *rot,bool visualization,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  element_type *peVar1;
  undefined8 uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  shared_ptr<chrono::ChConeShape> cone;
  shared_ptr<chrono::ChVisualModel> model;
  ChFrame<double> frame;
  __shared_ptr<chrono::ChConeShape,_(__gnu_cxx::_Lock_policy)2> local_1c0;
  double local_1b0;
  shared_ptr<chrono::ChVisualShape> local_1a8;
  undefined1 local_198 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  ChVector<double> local_178;
  __shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> local_160;
  __shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> local_150;
  undefined1 local_140 [136];
  ChFrame<double> local_b8;
  
  local_140._0_8_ = &DAT_3ff0000000000000;
  local_178.m_data[2] = 0.0;
  local_140._24_8_ = 0.0;
  local_178.m_data[0] = 0.0;
  local_178.m_data[1] = 0.0;
  local_140._8_8_ = (pointer)0x0;
  local_140._16_8_ = 0.0;
  local_1b0 = radius;
  ChFrame<double>::ChFrame(&local_b8,&local_178,(ChQuaternion<double> *)local_140);
  ChFrame<double>::ChFrame((ChFrame<double> *)local_140,pos,rot);
  ChFrame<double>::operator=(&local_b8,(ChFrame<double> *)local_140);
  if (body != (ChBody *)0x0) {
    lVar3 = __dynamic_cast(body,&ChBody::typeinfo,&ChBodyAuxRef::typeinfo,0);
    if (lVar3 != 0) {
      ChFrame<double>::operator>>
                ((ChFrame<double> *)local_140,&local_b8,(ChFrame<double> *)(lVar3 + 0x360));
      ChFrame<double>::operator=(&local_b8,(ChFrame<double> *)local_140);
    }
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = height * 0.25;
  auVar4 = vunpcklpd_avx(ZEXT816(0) << 0x40,auVar4);
  local_178.m_data[0] = auVar4._0_8_ + local_b8.coord.pos.m_data[0];
  local_178.m_data[1] = auVar4._8_8_ + local_b8.coord.pos.m_data[1];
  local_178.m_data[2] = local_b8.coord.pos.m_data[2] + 0.0;
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             &local_1c0,
             &(body->collision_model).
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>);
  peVar1 = local_1c0._M_ptr;
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> *)
             (local_198 + 0x10),
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  ChMatrix33<double>::Set_A_quaternion((ChMatrix33<double> *)local_140,rot);
  (*(peVar1->super_ChVisualShape)._vptr_ChVisualShape[10])
            (local_1b0,local_1b0,height,peVar1,local_198 + 0x10,&local_178,local_140);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_180);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c0._M_refcount);
  if (visualization) {
    ChPhysicsItem::GetVisualModel((ChPhysicsItem *)local_140);
    uVar2 = local_140._0_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_140 + 8));
    if ((element_type *)uVar2 == (element_type *)0x0) {
      std::make_shared<chrono::ChVisualModel>();
      std::__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_150,
                 (__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> *)local_140);
      ChPhysicsItem::AddVisualModel
                (&body->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)&local_150);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_140 + 8));
    }
    chrono_types::make_shared<chrono::ChConeShape,_0>();
    ((local_1c0._M_ptr)->gcone).rad.m_data[0] = local_1b0;
    ((local_1c0._M_ptr)->gcone).rad.m_data[1] = height;
    ((local_1c0._M_ptr)->gcone).rad.m_data[2] = local_1b0;
    std::__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_160,
               &vis_material->
                super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>);
    ChVisualShape::AddMaterial
              (&(local_1c0._M_ptr)->super_ChVisualShape,
               (shared_ptr<chrono::ChVisualMaterial> *)&local_160);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160._M_refcount);
    ChPhysicsItem::GetVisualModel((ChPhysicsItem *)local_198);
    std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChConeShape,void>
              ((__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> *)&local_1a8,
               &local_1c0);
    ChFrame<double>::ChFrame((ChFrame<double> *)local_140,&local_178,rot);
    ChVisualModel::AddShape
              ((ChVisualModel *)local_198._0_8_,&local_1a8,(ChFrame<double> *)local_140);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1a8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_198 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c0._M_refcount);
  }
  return;
}

Assistant:

void AddConeGeometry(ChBody* body,
                     std::shared_ptr<ChMaterialSurface> material,
                     double radius,
                     double height,
                     const ChVector<>& pos,
                     const ChQuaternion<>& rot,
                     bool visualization,
                     std::shared_ptr<ChVisualMaterial> vis_material) {
    ChFrame<> frame;
    frame = ChFrame<>(pos, rot);
    if (ChBodyAuxRef* body_ar = dynamic_cast<ChBodyAuxRef*>(body)) {
        frame = frame >> body_ar->GetFrame_REF_to_COG();
    }
    ChVector<> pos_shifted = frame.GetPos() + ChVector<>(0, 0.25 * height, 0);

    body->GetCollisionModel()->AddCone(material, radius, radius, height, pos_shifted, rot);

    if (visualization) {
        if (!body->GetVisualModel()) {
            auto model = chrono_types::make_shared<ChVisualModel>();
            body->AddVisualModel(model);
        }
        auto cone = chrono_types::make_shared<ChConeShape>();
        cone->GetConeGeometry().rad = ChVector<>(radius, height, radius);
        cone->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(cone, ChFrame<>(pos_shifted, rot));
    }
}